

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O0

void __thiscall mraa::Iio::writeFloat(Iio *this,string *attributeName,float value)

{
  mraa_iio_context p_Var1;
  int iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  runtime_error *this_00;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream oss;
  mraa_result_t res;
  float value_local;
  string *attributeName_local;
  Iio *this_local;
  
  p_Var1 = this->m_iio;
  uVar3 = std::__cxx11::string::c_str();
  iVar2 = mraa_iio_write_float(value,p_Var1,uVar3);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar4 = std::operator<<((ostream *)local_198,"IIO writeFloat for attibute ");
    poVar4 = std::operator<<(poVar4,(string *)attributeName);
    std::operator<<(poVar4," failed");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this_00,local_1c8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void
    writeFloat(const std::string& attributeName, float value) const
    {
        mraa_result_t res = mraa_iio_write_float(m_iio, attributeName.c_str(), value);
        if (res != MRAA_SUCCESS) {
            std::ostringstream oss;
            oss << "IIO writeFloat for attibute " << attributeName << " failed";
            throw std::runtime_error(oss.str());
        }
    }